

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

void sensors_analytics::Sdk::ItemSet(string *item_type,string *item_id,PropertiesNode *properties)

{
  Sdk *this;
  allocator local_41;
  string local_40 [32];
  ObjectNode *local_20;
  PropertiesNode *properties_local;
  string *item_id_local;
  string *item_type_local;
  
  this = instance_;
  if (instance_ != (Sdk *)0x0) {
    local_20 = &properties->super_ObjectNode;
    properties_local = (PropertiesNode *)item_id;
    item_id_local = item_type;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"item_set",&local_41);
    AddItemEvent(this,(string *)local_40,item_id_local,(string *)properties_local,local_20);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return;
}

Assistant:

void Sdk::ItemSet(const std::string &item_type, const std::string &item_id,
                  sensors_analytics::PropertiesNode &properties) {
  if (instance_) {
    instance_->AddItemEvent("item_set", item_type, item_id, properties);
  }
}